

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functors.h
# Opt level: O2

void __thiscall
Eigen::internal::linspaced_op_impl<int,_false>::linspaced_op_impl
          (linspaced_op_impl<int,_false> *this,int *low,int *step)

{
  int iVar1;
  int extraout_XMM0_Da;
  int extraout_XMM0_Db;
  int extraout_XMM0_Dc;
  int extraout_XMM0_Dd;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  longlong local_38 [2];
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  
  this->m_low = *low;
  iVar1 = *step;
  this->m_step = iVar1;
  *(int *)this->m_packetStep = iVar1 << 2;
  *(int *)((long)this->m_packetStep + 4) = iVar1 << 2;
  *(int *)(this->m_packetStep + 1) = iVar1 << 2;
  *(int *)((long)this->m_packetStep + 0xc) = iVar1 << 2;
  local_28 = *low;
  local_48 = *step;
  local_38[0] = -0x200000004;
  local_38[1] = -2;
  iStack_44 = local_48;
  iStack_40 = local_48;
  iStack_3c = local_48;
  iStack_24 = local_28;
  iStack_20 = local_28;
  iStack_1c = local_28;
  pmul<long_long__vector(2)>((Packet4i *)&local_48,&local_38);
  *(int *)this->m_base = extraout_XMM0_Da + local_28;
  *(int *)((long)this->m_base + 4) = extraout_XMM0_Db + iStack_24;
  *(int *)(this->m_base + 1) = extraout_XMM0_Dc + iStack_20;
  *(int *)((long)this->m_base + 0xc) = extraout_XMM0_Dd + iStack_1c;
  return;
}

Assistant:

linspaced_op_impl(const Scalar& low, const Scalar& step) :
  m_low(low), m_step(step),
  m_packetStep(pset1<Packet>(packet_traits<Scalar>::size*step)),
  m_base(padd(pset1<Packet>(low), pmul(pset1<Packet>(step),plset<Scalar>(-packet_traits<Scalar>::size)))) {}